

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

void htmlAutoCloseOnClose(htmlParserCtxtPtr ctxt,xmlChar *newtag)

{
  int iVar1;
  int iVar2;
  htmlElemDesc *phVar3;
  int local_24;
  int priority;
  int i;
  htmlElemDesc *info;
  xmlChar *newtag_local;
  htmlParserCtxtPtr ctxt_local;
  
  iVar1 = htmlGetEndPriority(newtag);
  local_24 = ctxt->nameNr;
  while ((local_24 = local_24 + -1, -1 < local_24 &&
         (iVar2 = xmlStrEqual(newtag,ctxt->nameTab[local_24]), iVar2 == 0))) {
    iVar2 = htmlGetEndPriority(ctxt->nameTab[local_24]);
    if (iVar1 < iVar2) {
      return;
    }
  }
  if (local_24 < 0) {
    return;
  }
  while (iVar1 = xmlStrEqual(newtag,ctxt->name), iVar1 == 0) {
    phVar3 = htmlTagLookup(ctxt->name);
    if ((phVar3 != (htmlElemDesc *)0x0) && (phVar3->endTag == '\x03')) {
      htmlParseErr(ctxt,XML_ERR_TAG_NAME_MISMATCH,"Opening and ending tag mismatch: %s and %s\n",
                   newtag,ctxt->name);
    }
    if ((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->sax->endElement != (endElementSAXFunc)0x0)) {
      (*ctxt->sax->endElement)(ctxt->userData,ctxt->name);
    }
    htmlnamePop(ctxt);
  }
  return;
}

Assistant:

static void
htmlAutoCloseOnClose(htmlParserCtxtPtr ctxt, const xmlChar * newtag)
{
    const htmlElemDesc *info;
    int i, priority;

    priority = htmlGetEndPriority(newtag);

    for (i = (ctxt->nameNr - 1); i >= 0; i--) {

        if (xmlStrEqual(newtag, ctxt->nameTab[i]))
            break;
        /*
         * A misplaced endtag can only close elements with lower
         * or equal priority, so if we find an element with higher
         * priority before we find an element with
         * matching name, we just ignore this endtag
         */
        if (htmlGetEndPriority(ctxt->nameTab[i]) > priority)
            return;
    }
    if (i < 0)
        return;

    while (!xmlStrEqual(newtag, ctxt->name)) {
        info = htmlTagLookup(ctxt->name);
        if ((info != NULL) && (info->endTag == 3)) {
            htmlParseErr(ctxt, XML_ERR_TAG_NAME_MISMATCH,
	                 "Opening and ending tag mismatch: %s and %s\n",
			 newtag, ctxt->name);
        }
        if ((ctxt->sax != NULL) && (ctxt->sax->endElement != NULL))
            ctxt->sax->endElement(ctxt->userData, ctxt->name);
	htmlnamePop(ctxt);
    }
}